

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O3

void FACT_INTERNAL_OnStreamEnd(FAudioVoiceCallback *callback)

{
  char *pcVar1;
  OnBufferEndFunc p_Var2;
  long lVar3;
  
  p_Var2 = callback[1].OnBufferEnd;
  *(undefined4 *)(p_Var2 + 0x20) = 0x20;
  lVar3 = *(long *)(p_Var2 + 8);
  if ((lVar3 != 0) && (*(OnBufferEndFunc *)(lVar3 + 0x40) == p_Var2)) {
    *(uint *)(lVar3 + 0x3c) = *(uint *)(lVar3 + 0x3c) & 0xffffffc7 | 0x20;
    pcVar1 = (char *)(*(long *)(lVar3 + 0x20) + 0x13);
    *pcVar1 = *pcVar1 + -1;
    return;
  }
  return;
}

Assistant:

void FACT_INTERNAL_OnStreamEnd(FAudioVoiceCallback *callback)
{
	FACTWaveCallback *c = (FACTWaveCallback*) callback;

	c->wave->state = FACT_STATE_STOPPED;

	if (	c->wave->parentCue != NULL &&
		c->wave->parentCue->simpleWave == c->wave	)
	{
		c->wave->parentCue->state |= FACT_STATE_STOPPED;
		c->wave->parentCue->state &= ~(
			FACT_STATE_PLAYING |
			FACT_STATE_STOPPING
		);
		c->wave->parentCue->data->instanceCount -= 1;
	}
}